

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

bool __thiscall
SListBase<Js::JSONStringifier::PropertyListElement,_Memory::Recycler,_RealCount>::Prepend
          (SListBase<Js::JSONStringifier::PropertyListElement,_Memory::Recycler,_RealCount> *this,
          Recycler *allocator,PropertyListElement *data)

{
  SListNode<Js::JSONStringifier::PropertyListElement,_Memory::Recycler> *ptr;
  Recycler *alloc;
  SListNode<Js::JSONStringifier::PropertyListElement,_Memory::Recycler> *this_00;
  Type *pTVar1;
  Type *this_01;
  TrackAllocData local_58;
  SListNode<Js::JSONStringifier::PropertyListElement,_Memory::Recycler> *local_30;
  Node *newNode;
  PropertyListElement *data_local;
  Recycler *allocator_local;
  SListBase<Js::JSONStringifier::PropertyListElement,_Memory::Recycler,_RealCount> *this_local;
  
  newNode = (Node *)data;
  data_local = (PropertyListElement *)allocator;
  allocator_local = (Recycler *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,
             (type_info *)
             &SListNode<Js::JSONStringifier::PropertyListElement,Memory::Recycler>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
             ,0x13b);
  alloc = Memory::Recycler::TrackAllocInfo(allocator,&local_58);
  this_00 = (SListNode<Js::JSONStringifier::PropertyListElement,_Memory::Recycler> *)
            new<Memory::Recycler>(0x18,alloc,0x446fd0);
  SListNode<Js::JSONStringifier::PropertyListElement,_Memory::Recycler>::
  SListNode<Js::JSONStringifier::PropertyListElement>(this_00,(PropertyListElement *)newNode);
  if (this_00 != (SListNode<Js::JSONStringifier::PropertyListElement,_Memory::Recycler> *)0x0) {
    local_30 = this_00;
    pTVar1 = SListNodeBase<Memory::Recycler>::Next(&this->super_SListNodeBase<Memory::Recycler>);
    this_01 = SListNodeBase<Memory::Recycler>::Next
                        (&local_30->super_SListNodeBase<Memory::Recycler>);
    Memory::WriteBarrierPtr<SListNodeBase<Memory::Recycler>_>::operator=(this_01,pTVar1);
    ptr = local_30;
    pTVar1 = SListNodeBase<Memory::Recycler>::Next(&this->super_SListNodeBase<Memory::Recycler>);
    Memory::WriteBarrierPtr<SListNodeBase<Memory::Recycler>_>::operator=
              (pTVar1,&ptr->super_SListNodeBase<Memory::Recycler>);
    RealCount::IncrementCount(&this->super_RealCount);
  }
  return this_00 != (SListNode<Js::JSONStringifier::PropertyListElement,_Memory::Recycler> *)0x0;
}

Assistant:

bool Prepend(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            newNode->Next() = this->Next();
            this->Next() = newNode;
            this->IncrementCount();
            return true;
        }
        return false;
    }